

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_table_entry.cpp
# Opt level: O2

unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> __thiscall
duckdb::DuckTableEntry::DropNotNull
          (DuckTableEntry *this,ClientContext *context,DropNotNullInfo *info)

{
  Catalog *args;
  SchemaCatalogEntry *args_1;
  __uniq_ptr_impl<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_> _Var1;
  pointer pCVar2;
  LogicalIndex LVar3;
  reference this_00;
  pointer pCVar4;
  NotNullConstraint *pNVar5;
  Binder *info_00;
  type args_2;
  long in_RCX;
  ulong __n;
  unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
  bound_create_info;
  shared_ptr<duckdb::Binder,_true> binder;
  _Head_base<0UL,_duckdb::CreateTableInfo_*,_false> local_d0;
  undefined1 local_c8 [16];
  __uniq_ptr_impl<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_> local_b8;
  optional_ptr<duckdb::CatalogSet,_true> local_b0;
  _Alloc_hider local_a8;
  _Head_base<0UL,_duckdb::Constraint_*,_false> local_a0;
  
  local_b8._M_t.
  super__Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>.
  super__Head_base<0UL,_duckdb::CatalogEntry_*,_false>._M_head_impl =
       (tuple<duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>)
       (tuple<duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>)this;
  local_b0.ptr = (CatalogSet *)info;
  make_uniq<duckdb::CreateTableInfo,duckdb::SchemaCatalogEntry&,std::__cxx11::string&>
            ((duckdb *)&local_d0,
             *(SchemaCatalogEntry **)&(context->config).query_verification_enabled,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &context->interrupted);
  pCVar2 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_d0);
  Value::operator=(&(pCVar2->super_CreateInfo).comment,
                   (Value *)((long)&(context->config).home_directory.field_2 + 8));
  pCVar2 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_d0);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::operator=((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)&(pCVar2->super_CreateInfo).tags,
              (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)&(context->config).profiler_settings._M_h._M_before_begin);
  ColumnList::Copy((ColumnList *)&stack0xffffffffffffff60,
                   (ColumnList *)&(context->config).asof_loop_join_threshold);
  pCVar2 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_d0);
  ColumnList::operator=(&pCVar2->columns,(ColumnList *)&stack0xffffffffffffff60);
  ColumnList::~ColumnList((ColumnList *)&stack0xffffffffffffff60);
  LVar3 = TableCatalogEntry::GetColumnIndex
                    ((TableCatalogEntry *)context,(string *)(in_RCX + 0x78),false);
  __n = 0;
  do {
    if ((ulong)((long)((long)(context->config).set_variables._M_h._M_single_bucket -
                      (context->config).set_variables._M_h._M_rehash_policy._M_next_resize) >> 3) <=
        __n) {
      Binder::CreateBinder
                ((Binder *)&stack0xffffffffffffff60,(ClientContext *)local_b0.ptr,
                 (optional_ptr<duckdb::Binder,_true>)0x0,REGULAR_BINDER);
      info_00 = shared_ptr<duckdb::Binder,_true>::operator->
                          ((shared_ptr<duckdb::Binder,_true> *)&stack0xffffffffffffff60);
      local_c8._0_8_ = local_d0._M_head_impl;
      local_d0._M_head_impl = (CreateTableInfo *)0x0;
      Binder::BindCreateTableInfo
                ((Binder *)(local_c8 + 8),
                 (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *)
                 info_00,(SchemaCatalogEntry *)local_c8);
      if ((CreateTableInfo *)local_c8._0_8_ != (CreateTableInfo *)0x0) {
        (*(((CreateInfo *)local_c8._0_8_)->super_ParseInfo)._vptr_ParseInfo[1])();
      }
      local_c8._0_8_ = (_func_int **)0x0;
      args = (Catalog *)(context->config).max_expression_depth;
      args_1 = *(SchemaCatalogEntry **)&(context->config).query_verification_enabled;
      args_2 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
               ::operator*((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                            *)(local_c8 + 8));
      make_uniq<duckdb::DuckTableEntry,duckdb::Catalog&,duckdb::SchemaCatalogEntry&,duckdb::BoundCreateTableInfo&,duckdb::shared_ptr<duckdb::DataTable,true>&>
                ((duckdb *)&local_a8,args,args_1,args_2,
                 (shared_ptr<duckdb::DataTable,_true> *)
                 &(context->config).user_variables._M_h._M_bucket_count);
      _Var1._M_t.
      super__Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>.
      super__Head_base<0UL,_duckdb::CatalogEntry_*,_false>._M_head_impl =
           local_b8._M_t.
           super__Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>
           .super__Head_base<0UL,_duckdb::CatalogEntry_*,_false>._M_head_impl;
      *(pointer *)
       local_b8._M_t.
       super__Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>.
       super__Head_base<0UL,_duckdb::CatalogEntry_*,_false>._M_head_impl = local_a8._M_p;
      ::std::
      unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>::
      ~unique_ptr((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
                   *)(local_c8 + 8));
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffff68);
      if (local_d0._M_head_impl != (CreateTableInfo *)0x0) {
        (*((local_d0._M_head_impl)->super_CreateInfo).super_ParseInfo._vptr_ParseInfo[1])();
      }
      return (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)
             (_Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>)
             _Var1._M_t.
             super__Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>
             .super__Head_base<0UL,_duckdb::CatalogEntry_*,_false>._M_head_impl;
    }
    this_00 = vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
              ::get<true>((vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
                           *)&(context->config).set_variables._M_h._M_rehash_policy._M_next_resize,
                          __n);
    pCVar4 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
             operator->(this_00);
    (*pCVar4->_vptr_Constraint[3])
              ((unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *)
               &stack0xffffffffffffff60,pCVar4);
    pCVar4 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
             operator->((unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>
                         *)&stack0xffffffffffffff60);
    if (pCVar4->type == NOT_NULL) {
      pCVar4 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
               operator->((unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>
                           *)&stack0xffffffffffffff60);
      pNVar5 = Constraint::Cast<duckdb::NotNullConstraint>(pCVar4);
      if ((pNVar5->index).index != LVar3.index) goto LAB_018cc42e;
    }
    else {
LAB_018cc42e:
      pCVar2 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
               ::operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                             *)&local_d0);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>>
                  *)&pCVar2->constraints,
                 (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *)
                 &stack0xffffffffffffff60);
    }
    if (local_a0._M_head_impl != (Constraint *)0x0) {
      (**(code **)(*(long *)local_a0._M_head_impl + 8))();
    }
    __n = __n + 1;
  } while( true );
}

Assistant:

unique_ptr<CatalogEntry> DuckTableEntry::DropNotNull(ClientContext &context, DropNotNullInfo &info) {
	auto create_info = make_uniq<CreateTableInfo>(schema, name);
	create_info->comment = comment;
	create_info->tags = tags;
	create_info->columns = columns.Copy();

	auto not_null_idx = GetColumnIndex(info.column_name);
	for (idx_t i = 0; i < constraints.size(); i++) {
		auto constraint = constraints[i]->Copy();
		// Skip/drop not_null
		if (constraint->type == ConstraintType::NOT_NULL) {
			auto &not_null = constraint->Cast<NotNullConstraint>();
			if (not_null.index == not_null_idx) {
				continue;
			}
		}
		create_info->constraints.push_back(std::move(constraint));
	}

	auto binder = Binder::CreateBinder(context);
	auto bound_create_info = binder->BindCreateTableInfo(std::move(create_info), schema);
	return make_uniq<DuckTableEntry>(catalog, schema, *bound_create_info, storage);
}